

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_secrets.cpp
# Opt level: O3

unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>,_true> __thiscall
duckdb::CreateHTTPSecretFunctions::CreateHTTPSecretFromConfig
          (CreateHTTPSecretFunctions *this,ClientContext *context,CreateSecretInput *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  KeyValueSecret *this_00;
  pointer pKVar2;
  pointer *__ptr;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  _Head_base<0UL,_duckdb::KeyValueSecret_*,_false> local_58;
  string local_50;
  
  this_00 = (KeyValueSecret *)operator_new(0xf0);
  KeyValueSecret::KeyValueSecret(this_00,&input->scope,&input->type,&input->provider,&input->name);
  local_58._M_head_impl = this_00;
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_58);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"http_proxy","");
  KeyValueSecret::TrySetValue(pKVar2,&local_50,input);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_58);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"http_proxy_password","");
  KeyValueSecret::TrySetValue(pKVar2,&local_50,input);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_58);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"http_proxy_username","");
  KeyValueSecret::TrySetValue(pKVar2,&local_50,input);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_58);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"extra_http_headers","");
  KeyValueSecret::TrySetValue(pKVar2,&local_50,input);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_58);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"bearer_token","");
  KeyValueSecret::TrySetValue(pKVar2,&local_50,input);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"http_proxy_password","");
  pKVar2 = unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>::
           operator->((unique_ptr<duckdb::KeyValueSecret,_std::default_delete<duckdb::KeyValueSecret>,_true>
                       *)&local_58);
  __l._M_len = 1;
  __l._M_array = &local_50;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::operator=(&(pKVar2->redact_keys)._M_h,__l);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  *(KeyValueSecret **)this = local_58._M_head_impl;
  return (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>_>)
         (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>_>)this;
}

Assistant:

unique_ptr<BaseSecret> CreateHTTPSecretFunctions::CreateHTTPSecretFromConfig(ClientContext &context,
                                                                             CreateSecretInput &input) {
	auto secret = make_uniq<KeyValueSecret>(input.scope, input.type, input.provider, input.name);

	secret->TrySetValue("http_proxy", input);
	secret->TrySetValue("http_proxy_password", input);
	secret->TrySetValue("http_proxy_username", input);

	secret->TrySetValue("extra_http_headers", input);
	secret->TrySetValue("bearer_token", input);

	//! Set redact keys
	secret->redact_keys = {"http_proxy_password"};

	return std::move(secret);
}